

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O2

FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *
Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
_mul(FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
     *__return_storage_ptr__,AbstractingUnifier *au,Numeral *k,
    FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *s)

{
  bool bVar1;
  anon_class_8_1_54a3980b procArray;
  undefined8 local_50;
  RationalConstantType local_48;
  
  RationalConstantType::RationalConstantType(&local_48,k);
  local_50 = (Numeral *)((ulong)local_50._4_4_ << 0x20);
  bVar1 = Kernel::operator==(&local_48,(int *)&local_50);
  RationalConstantType::~RationalConstantType(&local_48);
  if (bVar1) {
    zero();
  }
  else {
    local_50 = k;
    FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::
    _mul(Kernel::AbstractingUnifier&,Kernel::RationalConstantType_const&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>)
    ::{lambda(auto:1&)#1}::operator()
              ((_lambda_auto_1___1_ *)&local_50,
               (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
               (s->ratVars)._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               .
               super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
              );
    FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::
    _mul(Kernel::AbstractingUnifier&,Kernel::RationalConstantType_const&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>)
    ::{lambda(auto:1&)#1}::operator()
              ((_lambda_auto_1___1_ *)&local_50,
               (s->intVars)._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               .
               super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
               ._M_head_impl);
    FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::
    _mul(Kernel::AbstractingUnifier&,Kernel::RationalConstantType_const&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>)
    ::{lambda(auto:1&)#1}::operator()
              ((_lambda_auto_1___1_ *)&local_50,
               (s->mixVars)._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               .
               super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
               ._M_head_impl);
    FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::
    _mul(Kernel::AbstractingUnifier&,Kernel::RationalConstantType_const&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>)
    ::{lambda(auto:1&)#1}::operator()
              ((_lambda_auto_1___1_ *)&local_50,
               (s->ratAtoms)._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               .
               super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
               ._M_head_impl);
    FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::
    _mul(Kernel::AbstractingUnifier&,Kernel::RationalConstantType_const&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>)
    ::{lambda(auto:1&)#1}::operator()
              ((_lambda_auto_1___1_ *)&local_50,
               (s->intAtoms)._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               .
               super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
               ._M_head_impl);
    FloorUwaState(__return_storage_ptr__,s);
  }
  return __return_storage_ptr__;
}

Assistant:

static FloorUwaState _mul(AbstractingUnifier& au, Numeral const& k, FloorUwaState s) {
    if (k == 0) {
      return FloorUwaState::zero();
    } else {
      auto procArray = [&](auto& sum) { 
        for (auto& s : sum) {
          s.second *= k;
        }
      };
      procArray(*s.ratVars);
      procArray(*s.intVars);
      procArray(*s.mixVars);
      procArray(*s.ratAtoms);
      procArray(*s.intAtoms);
      return s;
    }
  }